

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_part.c
# Opt level: O2

REF_STATUS ref_part_cad_discrete_edge(REF_GRID ref_grid,char *filename)

{
  long *plVar1;
  REF_MPI pRVar2;
  REF_NODE ref_node;
  REF_CELL pRVar3;
  bool bVar4;
  REF_FILEPOS RVar5;
  int iVar6;
  uint uVar7;
  REF_STATUS RVar8;
  size_t sVar9;
  FILE *__stream;
  ulong uVar10;
  void *pvVar11;
  size_t sVar12;
  __off_t _Var13;
  long lVar14;
  undefined8 uVar15;
  void *pvVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  char *pcVar20;
  long lVar21;
  ulong uVar22;
  bool bVar23;
  ulong uStackY_670;
  REF_BOOL available;
  REF_INT version;
  uint local_654;
  void *local_650;
  FILE *local_648;
  long local_640;
  ulong local_638;
  void *local_630;
  void *local_628;
  void *local_620;
  REF_FILEPOS next_position;
  REF_INT local_610;
  REF_INT local;
  ulong local_608;
  REF_MPI local_600;
  ulong local_5f8;
  ulong local_5f0;
  ulong local_5e8;
  REF_LONG ncell;
  long local_5d8;
  long local_5d0;
  long local_5c8;
  long local_5c0;
  void *local_5b8;
  REF_CELL local_5b0;
  long local_5a8;
  ulong local_5a0;
  REF_LONG local_598;
  REF_INT dim;
  REF_INT new_cell;
  REF_INT local_588 [28];
  REF_FILEPOS key_pos [156];
  
  pRVar2 = ref_grid->mpi;
  ref_node = ref_grid->node;
  next_position = -1;
  sVar9 = strlen(filename);
  iVar6 = strcmp(filename + (sVar9 - 6),".meshb");
  if (iVar6 != 0) {
    pcVar20 = "expected .meshb extension";
    uStackY_670 = 3;
    uVar15 = 0x3f5;
    goto LAB_00182dd1;
  }
  if (pRVar2->id == 0) {
    uVar7 = ref_import_meshb_header(filename,&version,key_pos);
    if (uVar7 != 0) {
      uStackY_670 = (ulong)uVar7;
      pcVar20 = "header";
      uVar15 = 0x3f9;
      goto LAB_00182dd1;
    }
    __stream = fopen(filename,"r");
    if (__stream == (FILE *)0x0) {
      RVar8 = 2;
      printf("unable to open %s\n",filename);
      pcVar20 = "unable to open file";
      uVar15 = 0x3fe;
      goto LAB_00182f9d;
    }
    uVar7 = ref_import_meshb_jump((FILE *)__stream,version,key_pos,3,&available,&next_position);
    if (uVar7 != 0) {
      uStackY_670 = (ulong)uVar7;
      pcVar20 = "jump";
      uVar15 = 0x401;
      goto LAB_00182dd1;
    }
    RVar8 = 1;
    if (available == 0) {
      pcVar20 = "meshb missing dimension";
      uVar15 = 0x402;
      goto LAB_00182f9d;
    }
    sVar9 = fread(&dim,4,1,__stream);
    if (sVar9 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x403,
             "ref_part_cad_discrete_edge","dim",1,sVar9);
      return 1;
    }
  }
  else {
    __stream = (FILE *)0x0;
  }
  uStackY_670 = 1;
  uVar7 = ref_mpi_bcast(pRVar2,&version,1,1);
  if (uVar7 != 0) {
    pcVar20 = "bcast";
    uVar15 = 0x406;
LAB_00182e9c:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar15,
           "ref_part_cad_discrete_edge",(ulong)uVar7,pcVar20);
    return uVar7;
  }
  uVar7 = ref_cell_free(ref_grid->cell[0]);
  if (uVar7 != 0) {
    pcVar20 = "clear out edge";
    uVar15 = 0x408;
    goto LAB_00182e9c;
  }
  local_648 = __stream;
  uVar7 = ref_cell_create(ref_grid->cell,REF_CELL_EDG);
  if (uVar7 != 0) {
    pcVar20 = "edg";
    uVar15 = 0x409;
LAB_00183124:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar15,
           "ref_part_cad_discrete_edge",(ulong)uVar7,pcVar20);
    return uVar7;
  }
  if (ref_grid->mpi->id == 0) {
    uVar7 = ref_import_meshb_jump((FILE *)local_648,version,key_pos,5,&available,&next_position);
    if (uVar7 != 0) {
      pcVar20 = "jump";
      uVar15 = 0x40e;
      goto LAB_00183124;
    }
    if ((available != 0) &&
       (RVar8 = ref_part_meshb_long((FILE *)local_648,version,&ncell), RVar8 != 0)) {
      pcVar20 = "ncell";
      uVar15 = 0x410;
      goto LAB_00182dd1;
    }
  }
  RVar8 = 1;
  uVar7 = ref_mpi_bcast(pRVar2,&available,1,1);
  if (uVar7 != 0) {
    pcVar20 = "bcast";
    uVar15 = 0x414;
    goto LAB_00183124;
  }
  if (available == 0) {
    pcVar20 = "no edge available in meshb";
    uVar15 = 0x416;
LAB_00182f9d:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar15,
           "ref_part_cad_discrete_edge",pcVar20);
    return RVar8;
  }
  uStackY_670 = 1;
  uVar7 = ref_mpi_bcast(pRVar2,&ncell,1,2);
  if (uVar7 != 0) {
    pcVar20 = "bcast";
    uVar15 = 0x418;
    goto LAB_00183124;
  }
  pRVar3 = ref_grid->cell[0];
  pRVar2 = ref_node->ref_mpi;
  uVar10 = ncell / (long)pRVar2->n;
  local_5e8 = 1000000;
  if (1000000 < (long)uVar10) {
    local_5e8 = uVar10;
  }
  local_638 = (ulong)pRVar3->size_per;
  uVar7 = pRVar3->size_per * (int)local_5e8;
  if ((int)uVar7 < 0) {
    pcVar20 = "malloc c2n of REF_GLOB negative";
    uVar15 = 0x275;
LAB_00183657:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar15,
           "ref_part_meshb_cell_bcast",pcVar20);
  }
  else {
    local_598 = ncell;
    local_610 = version;
    uVar10 = (ulong)pRVar3->node_per;
    pvVar11 = malloc((ulong)uVar7 << 3);
    if (pvVar11 == (void *)0x0) {
      pcVar20 = "malloc c2n of REF_GLOB NULL";
      uVar15 = 0x275;
    }
    else {
      lVar21 = uVar10 + 1;
      uVar7 = (int)lVar21 * (int)local_5e8;
      local_650 = pvVar11;
      local_5f8 = uVar10;
      if ((int)uVar7 < 0) {
        pcVar20 = "malloc c2n_int of REF_INT negative";
        uVar15 = 0x276;
        goto LAB_00183657;
      }
      local_628 = malloc((ulong)uVar7 * 4);
      if (local_628 == (void *)0x0) {
        pcVar20 = "malloc c2n_int of REF_INT NULL";
        uVar15 = 0x276;
      }
      else {
        uStackY_670 = (ulong)uVar7 << 3;
        local_600 = pRVar2;
        local_5b0 = pRVar3;
        local_630 = malloc(uStackY_670);
        if (local_630 != (void *)0x0) {
          local_608 = 0;
          if (0 < (int)local_638) {
            local_608 = local_638 & 0xffffffff;
          }
          uVar10 = 0;
          if (0 < (int)local_5f8) {
            uVar10 = local_5f8 & 0xffffffff;
          }
          local_5b8 = (void *)((long)local_650 + local_5f8 * 8);
          local_640 = local_638 * 8;
          local_5d0 = lVar21 * 8;
          local_5d8 = lVar21 * 4;
          lVar14 = 0;
          local_5c0 = lVar21;
LAB_001832ec:
          if (local_598 <= lVar14) {
            free(local_630);
            free(local_628);
            free(local_650);
LAB_0018368a:
            RVar5 = next_position;
            if (ref_grid->mpi->id != 0) {
              return 0;
            }
            _Var13 = ftello(local_648);
            if (RVar5 == _Var13) {
              fclose(local_648);
              return 0;
            }
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   0x41f,"ref_part_cad_discrete_edge","end location",RVar5,_Var13);
            return 1;
          }
          uVar7 = (int)local_598 - (int)lVar14;
          uVar22 = (ulong)uVar7;
          if ((int)local_5e8 < (int)uVar7) {
            uVar22 = local_5e8 & 0xffffffff;
          }
          local_654 = (uint)uVar22;
          local_5c8 = lVar14;
          if (local_600->id == 0) {
            sVar9 = (size_t)(int)(local_654 * (int)local_5c0);
            if (local_610 < 4) {
              sVar12 = fread(local_628,4,sVar9,local_648);
              if (sVar12 != sVar9) {
                pcVar20 = "int c2n";
                uVar15 = 0x27f;
LAB_0018381b:
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,uVar15,"ref_part_meshb_cell_bcast",pcVar20,sVar9,sVar12);
                uStackY_670 = 1;
                goto LAB_001836e7;
              }
              uVar17 = 0;
              if (0 < (int)local_654) {
                uVar17 = (ulong)local_654;
              }
              pvVar11 = local_628;
              pvVar16 = local_650;
              for (uVar22 = 0; uVar22 != uVar17; uVar22 = uVar22 + 1) {
                for (uVar19 = 0; local_608 != uVar19; uVar19 = uVar19 + 1) {
                  *(long *)((long)pvVar16 + uVar19 * 8) = (long)*(int *)((long)pvVar11 + uVar19 * 4)
                  ;
                }
                pvVar16 = (void *)((long)pvVar16 + local_640);
                pvVar11 = (void *)((long)pvVar11 + local_5d8);
              }
            }
            else {
              sVar12 = fread(local_630,8,sVar9,local_648);
              if (sVar12 != sVar9) {
                pcVar20 = "long c2n";
                uVar15 = 0x285;
                goto LAB_0018381b;
              }
              uVar17 = 0;
              if (0 < (int)local_654) {
                uVar17 = (ulong)local_654;
              }
              pvVar11 = local_630;
              pvVar16 = local_650;
              for (uVar22 = 0; uVar22 != uVar17; uVar22 = uVar22 + 1) {
                for (uVar19 = 0; local_608 != uVar19; uVar19 = uVar19 + 1) {
                  *(undefined8 *)((long)pvVar16 + uVar19 * 8) =
                       *(undefined8 *)((long)pvVar11 + uVar19 * 8);
                }
                pvVar16 = (void *)((long)pvVar16 + local_640);
                pvVar11 = (void *)((long)pvVar11 + local_5d0);
              }
            }
            uVar22 = (ulong)local_654;
            pvVar11 = local_650;
            for (uVar19 = 0; uVar19 != uVar17; uVar19 = uVar19 + 1) {
              for (uVar18 = 0; uVar10 != uVar18; uVar18 = uVar18 + 1) {
                plVar1 = (long *)((long)pvVar11 + uVar18 * 8);
                *plVar1 = *plVar1 + -1;
              }
              pvVar11 = (void *)((long)pvVar11 + local_640);
            }
          }
          pvVar11 = local_650;
          uVar7 = ref_mpi_bcast(local_600,local_650,(int)uVar22 * (int)local_638,2);
          if (uVar7 != 0) {
            uStackY_670 = (ulong)uVar7;
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   0x28f,"ref_part_meshb_cell_bcast",(ulong)uVar7,"broadcast read c2n");
            goto LAB_001836e7;
          }
          local_5a0 = 0;
          if (0 < (int)uVar22) {
            local_5a0 = uVar22;
          }
          local_620 = pvVar11;
          for (uVar22 = 0; uVar22 != local_5a0; uVar22 = uVar22 + 1) {
            local_5a8 = uVar22 * local_638;
            local_5f0 = uVar22;
            for (uVar17 = 0; uVar22 = local_5f0, uVar10 != uVar17; uVar17 = uVar17 + 1) {
              uVar7 = ref_node_local(ref_node,*(REF_GLOB *)((long)local_620 + uVar17 * 8),&local);
              if ((uVar7 != 0) && (uVar7 != 5)) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0x296,"ref_part_meshb_cell_bcast",(ulong)uVar7,"local");
                uStackY_670 = (ulong)uVar7;
              }
              if ((uVar7 != 5) && (uVar7 != 0)) {
                if ((int)uStackY_670 == 0) goto LAB_0018368a;
                goto LAB_001836e7;
              }
              uVar22 = local_5f0;
              if (local == -1) goto LAB_00183497;
              local_588[uVar17] = local;
            }
            if ((int)local_5f8 != (int)local_638) {
              local_588[local_5f8] = *(REF_INT *)((long)local_5b8 + local_5a8 * 8);
            }
            bVar23 = false;
            for (uVar17 = 0; uVar10 != uVar17; uVar17 = uVar17 + 1) {
              bVar4 = !bVar23;
              bVar23 = true;
              if (bVar4) {
                bVar23 = ref_node->ref_mpi->id == ref_node->part[local_588[uVar17]];
              }
            }
            if ((bVar23) && (uVar7 = ref_cell_add(local_5b0,local_588,&new_cell), uVar7 != 0)) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,0x2a7,"ref_part_meshb_cell_bcast",(ulong)uVar7,"add");
              uStackY_670 = (ulong)uVar7;
              goto LAB_001836e7;
            }
LAB_00183497:
            local_620 = (void *)((long)local_620 + local_640);
          }
          lVar14 = local_5c8 + (int)local_654;
          goto LAB_001832ec;
        }
        pcVar20 = "malloc c2n_long of REF_LONG NULL";
        uVar15 = 0x277;
      }
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar15,
           "ref_part_meshb_cell_bcast",pcVar20);
    uStackY_670 = 2;
  }
LAB_001836e7:
  pcVar20 = "part cell";
  uVar15 = 0x41c;
LAB_00182dd1:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar15,
         "ref_part_cad_discrete_edge",uStackY_670 & 0xffffffff,pcVar20);
  return (REF_STATUS)uStackY_670;
}

Assistant:

REF_FCN REF_STATUS ref_part_cad_discrete_edge(REF_GRID ref_grid,
                                              const char *filename) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  FILE *file;
  REF_INT version, dim;
  REF_BOOL available;
  REF_FILEPOS next_position = REF_EMPTY;
  REF_FILEPOS key_pos[REF_IMPORT_MESHB_LAST_KEYWORD];
  REF_LONG ncell;
  REF_BOOL verbose = REF_FALSE;
  size_t end_of_string;

  end_of_string = strlen(filename);

  if (strcmp(&filename[end_of_string - 6], ".meshb") != 0)
    RSS(REF_INVALID, "expected .meshb extension");

  file = NULL;
  if (ref_mpi_once(ref_mpi)) {
    RSS(ref_import_meshb_header(filename, &version, key_pos), "header");
    if (verbose) printf("meshb version %d\n", version);
    if (verbose) printf("open %s\n", filename);
    file = fopen(filename, "r");
    if (NULL == (void *)file) printf("unable to open %s\n", filename);
    RNS(file, "unable to open file");
    RSS(ref_import_meshb_jump(file, version, key_pos, 3, &available,
                              &next_position),
        "jump");
    RAS(available, "meshb missing dimension");
    REIS(1, fread((unsigned char *)&dim, 4, 1, file), "dim");
    if (verbose) printf("meshb dim %d\n", dim);
  }
  RSS(ref_mpi_bcast(ref_mpi, &version, 1, REF_INT_TYPE), "bcast");

  RSS(ref_cell_free(ref_grid_edg(ref_grid)), "clear out edge");
  RSS(ref_cell_create(&ref_grid_edg(ref_grid), REF_CELL_EDG), "edg");

  if (ref_grid_once(ref_grid)) {
    RSS(ref_import_meshb_jump(file, version, key_pos, 5, &available,
                              &next_position),
        "jump");
    if (available) {
      RSS(ref_part_meshb_long(file, version, &ncell), "ncell");
      if (verbose) printf("nedge %ld\n", ncell);
    }
  }
  RSS(ref_mpi_bcast(ref_mpi, &available, 1, REF_INT_TYPE), "bcast");

  RAS(available, "no edge available in meshb");

  RSS(ref_mpi_bcast(ref_mpi, &ncell, 1, REF_GLOB_TYPE), "bcast");

  RSS(ref_part_meshb_cell_bcast(ref_grid_edg(ref_grid), ncell, ref_node,
                                version, file),
      "part cell");

  if (ref_grid_once(ref_grid)) {
    REIS(next_position, ftello(file), "end location");
    fclose(file);
  }

  return REF_SUCCESS;
}